

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beast_Journal.cpp
# Opt level: O2

void __thiscall
beast::Journal::ScopedStream::ScopedStream(ScopedStream *this,Sink *sink,Severity level)

{
  long lVar1;
  
  this->m_sink = sink;
  this->m_level = level;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->m_ostream);
  lVar1 = *(long *)&this->m_ostream;
  *(uint *)(&this->field_0x28 + *(long *)(lVar1 + -0x18)) =
       *(uint *)(&this->field_0x28 + *(long *)(lVar1 + -0x18)) | 1;
  *(uint *)(&this->field_0x28 + *(long *)(lVar1 + -0x18)) =
       *(uint *)(&this->field_0x28 + *(long *)(lVar1 + -0x18)) | 0x200;
  return;
}

Assistant:

Journal::ScopedStream::ScopedStream (Sink& sink, Severity level)
    : m_sink (sink)
    , m_level (level)
{
    // Modifiers applied from all ctors
    m_ostream
        << std::boolalpha
        << std::showbase;
}